

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTransfer.cpp
# Opt level: O3

void __thiscall CTransfer::CTransfer(CTransfer *this,string *ip,int port)

{
  uchar *puVar1;
  pointer pcVar2;
  in_addr_t iVar3;
  long lVar4;
  
  this->_vptr_CTransfer = (_func_int **)&PTR___cxa_pure_virtual_0012b558;
  (this->ip)._M_dataplus._M_p = (pointer)&(this->ip).field_2;
  pcVar2 = (ip->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ip,pcVar2,pcVar2 + ip->_M_string_length);
  this->port = port;
  this->maxi = 0;
  this->nready = 0;
  bzero(&this->sockaddr,0x10);
  iVar3 = inet_addr((ip->_M_dataplus)._M_p);
  (this->sockaddr).sin_addr.s_addr = iVar3;
  (this->sockaddr).sin_port = (ushort)port << 8 | (ushort)port >> 8;
  (this->sockaddr).sin_family = 2;
  lVar4 = 9;
  do {
    puVar1 = (this->sockaddr).sin_zero + lVar4 * 8 + -0x14;
    puVar1[0] = 0xff;
    puVar1[1] = 0xff;
    puVar1[2] = 0xff;
    puVar1[3] = 0xff;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x3f1);
  return;
}

Assistant:

CTransfer::CTransfer(std::string ip,int port)
        :port(port),ip(ip),maxi(0),nready(0){
    bzero(&sockaddr,sizeof(sockaddr));
    sockaddr.sin_addr.s_addr = inet_addr(ip.c_str());
    sockaddr.sin_port = htons(port);
    sockaddr.sin_family = AF_INET;

    for(int i = 0;i < OPEN_MAX;i++){
        pollfds[i].fd = -1;
    }
}